

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall iDynTree::AttitudeQuaternionEKF::deserializeStateVector(AttitudeQuaternionEKF *this)

{
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
  *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffef0;
  Index in_stack_fffffffffffffef8;
  Index in_stack_ffffffffffffff00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff08;
  
  toEigen((VectorDynSize *)in_stack_ffffffffffffff08);
  toEigen<4U>((VectorFixSize<4U> *)in_stack_ffffffffffffff08);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff08);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff08);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<4,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffef0,in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<3,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffef0,
             (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
              *)in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<3,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffef0,
             (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
              *)in_RDI);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::deserializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    q = x.block<4, 1>(0, 0);
    Omega = x.block<3, 1>(4, 0);
    b = x.block<3, 1>(7, 0);
}